

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void scale_patch_internal(double alpha,int ndim,double *patch1,int *lo1,int *hi1,int *dims1)

{
  int iVar1;
  long lVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  int *in_R8;
  double in_XMM0_Qa;
  int diff;
  Integer offset1;
  Integer idx1;
  int subscr1 [7];
  int elems;
  int j;
  int i;
  long local_68;
  int local_58 [7];
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  int *local_28;
  int *local_20;
  long local_18;
  int local_c;
  double local_8;
  
  local_3c = 1;
  local_68 = 0;
  local_34 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_EDI;
  local_8 = in_XMM0_Qa;
  while( true ) {
    if (local_c <= local_34) {
      for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
        iVar1 = Index(local_c,local_58,local_30);
        if (local_38 == 0) {
          local_68 = (long)iVar1;
        }
        lVar2 = iVar1 - local_68;
        *(double *)(local_18 + lVar2 * 8) = local_8 * *(double *)(local_18 + lVar2 * 8);
        update_subscript(local_c,local_58,local_20,local_28,local_30);
      }
      return;
    }
    if (local_30[local_34] <= local_28[local_34] - local_20[local_34]) break;
    local_3c = ((local_28[local_34] - local_20[local_34]) + 1) * local_3c;
    local_58[local_34] = local_20[local_34];
    local_34 = local_34 + 1;
  }
  __assert_fail("diff < dims1[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x13a,"void scale_patch_internal(double, int, double *, int *, int *, int *)");
}

Assistant:

void scale_patch_internal(double alpha, int ndim, double *patch1, 
                 int lo1[], int hi1[], int dims1[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM];
    Integer idx1, offset1=0;

    for(i=0;i<ndim;i++){   /* count # of elements in patch */
        int diff = hi1[i]-lo1[i];
        assert(diff < dims1[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
    }

    /* scale element values in both patches */ 
    for(j=0; j< elems; j++){ 
        
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    

        if(j==0){
            offset1 =idx1;
        }
        idx1 -= offset1;

        patch1[idx1] *= alpha;
        update_subscript(ndim, subscr1, lo1,hi1, dims1);
    }    
}